

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

fdb_status
filemgr_write_dirty(filemgr *file,bid_t bid,void *buf,filemgr_dirty_update_node *node,
                   err_log_callback *log_callback)

{
  int iVar1;
  void *in_RDX;
  avl_node *in_RSI;
  long in_RDI;
  void *addr;
  filemgr_dirty_update_block query;
  filemgr_dirty_update_block *block;
  avl_node *a;
  avl_node *local_70;
  avl_cmp_func *in_stack_ffffffffffffff98;
  avl_node *in_stack_ffffffffffffffa0;
  avl_tree *in_stack_ffffffffffffffa8;
  avl_node *in_stack_ffffffffffffffb0;
  avl_node *tree;
  avl_node *local_38;
  
  tree = in_RSI;
  local_38 = avl_search(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff98);
  if (local_38 == (avl_node *)0x0) {
    local_38 = (avl_node *)calloc(1,0x30);
    local_70 = (avl_node *)0x0;
    iVar1 = posix_memalign(&local_70,0x200,(ulong)*(uint *)(in_RDI + 0x10));
    if (iVar1 != 0) {
      local_70 = (avl_node *)0x0;
    }
    local_38[1].parent = local_70;
    local_38[1].left = in_RSI;
    *(undefined1 *)&local_38[1].right = 0;
    avl_insert((avl_tree *)tree,in_stack_ffffffffffffffb0,(avl_cmp_func *)in_stack_ffffffffffffffa8)
    ;
  }
  memcpy(local_38[1].parent,in_RDX,(ulong)*(uint *)(in_RDI + 0x10));
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status filemgr_write_dirty(struct filemgr *file, bid_t bid, void *buf,
                               struct filemgr_dirty_update_node *node,
                               err_log_callback *log_callback)
{
    struct avl_node *a;
    struct filemgr_dirty_update_block *block, query;

    query.bid = bid;
    a = avl_search(&node->dirty_blocks, &query.avl, _dirty_blocks_cmp);
    if (a) {
        // already exist .. overwrite
        block = _get_entry(a, struct filemgr_dirty_update_block, avl);
    } else {
        // not exist .. create a new block for this update node
        block = (struct filemgr_dirty_update_block *)
                calloc(1, sizeof(struct filemgr_dirty_update_block));
        void *addr = NULL;
        malloc_align(addr, FDB_SECTOR_SIZE, file->blocksize);
        block->addr = addr;
        block->bid = bid;
        block->immutable = false;
        avl_insert(&node->dirty_blocks, &block->avl, _dirty_blocks_cmp);
    }

    memcpy(block->addr, buf, file->blocksize);
    return FDB_RESULT_SUCCESS;
}